

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint32_t __thiscall google::protobuf::io::CodedInputStream::ReadTagSlow(CodedInputStream *this)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  pair<unsigned_long,_bool> pVar6;
  
  puVar5 = this->buffer_;
  puVar4 = this->buffer_end_;
  if (puVar5 == puVar4) {
    bVar2 = Refresh(this);
    if (!bVar2) {
      if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
        this->legitimate_message_end_ = true;
      }
      else {
        this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
      }
      return 0;
    }
    puVar5 = this->buffer_;
    puVar4 = this->buffer_end_;
  }
  if ((puVar5 < puVar4) && (uVar1 = *puVar5, -1 < (char)uVar1)) {
    this->buffer_ = puVar5 + 1;
    uVar3 = (int)(char)uVar1;
  }
  else {
    pVar6 = ReadVarint64Fallback(this);
    uVar3 = 0;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = (uint32_t)pVar6.first;
    }
  }
  return uVar3;
}

Assistant:

uint32_t CodedInputStream::ReadTagSlow() {
  if (buffer_ == buffer_end_) {
    // Call refresh.
    if (!Refresh()) {
      // Refresh failed.  Make sure that it failed due to EOF, not because
      // we hit total_bytes_limit_, which, unlike normal limits, is not a
      // valid place to end a message.
      int current_position = total_bytes_read_ - buffer_size_after_limit_;
      if (current_position >= total_bytes_limit_) {
        // Hit total_bytes_limit_.  But if we also hit the normal limit,
        // we're still OK.
        legitimate_message_end_ = current_limit_ == total_bytes_limit_;
      } else {
        legitimate_message_end_ = true;
      }
      return 0;
    }
  }

  // For the slow path, just do a 64-bit read. Try to optimize for one-byte tags
  // again, since we have now refreshed the buffer.
  uint64_t result = 0;
  if (!ReadVarint64(&result)) return 0;
  return static_cast<uint32_t>(result);
}